

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::util_HexStr::test_method(util_HexStr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Span<const_unsigned_char> s;
  size_t sVar3;
  _Alloc_hider _Var4;
  int iVar5;
  void *pvVar6;
  size_t i;
  long lVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  readonly_property<bool> rVar10;
  const_string file;
  Span<const_unsigned_char> s_00;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_01;
  const_string file_03;
  Span<const_unsigned_char> s_02;
  const_string file_04;
  Span<const_unsigned_char> s_03;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar11;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  string_view out_exp;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  char **local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  size_type lower;
  size_type upper;
  char *local_c0;
  char *local_b8;
  assertion_result local_b0;
  string local_98;
  string hex;
  string input;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xed;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  s_00.m_size = 0x41;
  s_00.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&local_98,s_00);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,HEX_PARSE_INPUT);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input.field_2._8_8_ = &out_exp;
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  hex.field_2._8_8_ = &upper;
  upper = (size_type)HEX_PARSE_INPUT;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  out_exp._M_len = (size_t)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c8f6,(size_t)&local_c0,0xed,&input,
             "HEX_PARSE_INPUT",&hex);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xee;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  HexStr_abi_cxx11_(&local_98,(Span<const_unsigned_char>)ZEXT816(0xf74c81));
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = &out_exp;
  upper = (long)"\x05\x04\x03\x02\x01" + 5;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  hex.field_2._8_8_ = &upper;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  out_exp._M_len = (size_t)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c91f,(size_t)&local_c0,0xee,&input,"\"\"",&hex);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xef;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  HexStr_abi_cxx11_(&local_98,(Span<const_unsigned_char>)ZEXT816(0xf74c40));
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = &out_exp;
  upper = (long)"\x05\x04\x03\x02\x01" + 5;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  hex.field_2._8_8_ = &upper;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  out_exp._M_len = (size_t)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c946,(size_t)&local_c0,0xef,&input,"\"\"",&hex);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  out_exp._M_len = 10;
  out_exp._M_str = "04678afdb0";
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xf7;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  s_01.m_size = 5;
  s_01.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&local_98,s_01);
  if (out_exp._M_len == local_98._M_string_length) {
    if (out_exp._M_len == 0) {
      rVar10.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp(out_exp._M_str,local_98._M_dataplus._M_p,out_exp._M_len);
      rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = &upper;
  hex.field_2._8_8_ = &lower;
  lower = (size_type)&out_exp;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  upper = (size_type)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c979,(size_t)&local_c0,0xf7,&input,"out_exp",&hex)
  ;
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xf8;
  file_03.m_begin = (iterator)&local_198;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  s_02.m_size = 5;
  s_02.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&local_98,s_02);
  if (out_exp._M_len == local_98._M_string_length) {
    if (out_exp._M_len == 0) {
      rVar10.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp(out_exp._M_str,local_98._M_dataplus._M_p,out_exp._M_len);
      rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = &upper;
  lower = (size_type)&out_exp;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  hex.field_2._8_8_ = &lower;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  upper = (size_type)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c986,(size_t)&local_c0,0xf8,&input,"out_exp",&hex)
  ;
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xf9;
  file_04.m_begin = (iterator)&local_1b8;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c8,
             msg_04);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xf6cf21;
  s_03.m_size = 5;
  s_03.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&local_98,s_03);
  if (out_exp._M_len == local_98._M_string_length) {
    if (out_exp._M_len == 0) {
      rVar10.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp(out_exp._M_str,local_98._M_dataplus._M_p,out_exp._M_len);
      rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "@;\x1f";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = &upper;
  lower = (size_type)&out_exp;
  hex._M_string_length._0_1_ = 0;
  hex._M_dataplus._M_p = "@;\x1f";
  hex.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  hex.field_2._8_8_ = &lower;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  upper = (size_type)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_110,1,2,REQUIRE,0xf6c993,(size_t)&local_c0,0xf9,&input,"out_exp",&hex)
  ;
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length._0_1_ = 0;
  input._M_string_length._1_7_ = 0;
  input.field_2._M_allocated_capacity = input.field_2._M_allocated_capacity & 0xffffffffffffff00;
  lVar7 = 0;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&input,(char)lVar7);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  s.m_size._0_1_ = (undefined1)input._M_string_length;
  s.m_data = (uchar *)input._M_dataplus._M_p;
  s.m_size._1_7_ = input._M_string_length._1_7_;
  HexStr_abi_cxx11_(&hex,s);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x103;
  file_05.m_begin = (iterator)&local_1d8;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1e8,
             msg_05);
  local_b0._0_8_ = CONCAT71(hex._M_string_length._1_7_,(undefined1)hex._M_string_length);
  local_b0.m_message.px = (element_type *)CONCAT44(local_b0.m_message.px._4_4_,0x200);
  _cVar11 = 0x6f3a5c;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate((assertion_result *)&local_98,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)&local_b0,false);
  local_c0 = "hex.size() == 512";
  local_b8 = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_c0;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  pvVar8 = (iterator)0x2;
  pvVar9 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_110,2,0xe,WARN,_cVar11,(size_t)&local_1f8,0x103);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  out_exp._M_len = 0;
  do {
    _Var4._M_p = hex._M_dataplus._M_p;
    sVar3 = out_exp._M_len;
    pvVar6 = memchr("0123456789abcdef",(int)hex._M_dataplus._M_p[out_exp._M_len * 2],0x10);
    upper = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - 0xf77f3cU;
    pvVar6 = memchr("0123456789abcdef",(int)_Var4._M_p[sVar3 * 2 + 1],0x10);
    lower = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - 0xf77f3cU;
    local_208 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_200 = "";
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x108;
    file_06.m_begin = (iterator)&local_208;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_218,
               msg_06);
    local_b0._0_8_ = &upper;
    local_b0.m_message.px =
         (element_type *)&std::basic_string_view<char,_std::char_traits<char>_>::npos;
    _cVar11 = 0x6f3bf3;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((assertion_result *)&local_98,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
                *)&local_b0,false);
    local_c0 = "upper != std::string_view::npos";
    local_b8 = "";
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_f8 = &local_c0;
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_220 = "";
    pvVar8 = (iterator)0x2;
    pvVar9 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,&local_110,2,0xe,WARN,_cVar11,(size_t)&local_228,0x108)
    ;
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    local_238 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_230 = "";
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x109;
    file_07.m_begin = (iterator)&local_238;
    msg_07.m_end = pvVar9;
    msg_07.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_248,
               msg_07);
    local_b0._0_8_ = &lower;
    local_b0.m_message.px =
         (element_type *)&std::basic_string_view<char,_std::char_traits<char>_>::npos;
    _cVar11 = 0x6f3cfb;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((assertion_result *)&local_98,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
                *)&local_b0,false);
    local_c0 = "lower != std::string_view::npos";
    local_b8 = "";
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_f8 = &local_c0;
    local_258 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_250 = "";
    pvVar8 = (iterator)0x2;
    pvVar9 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,&local_110,2,0xe,WARN,_cVar11,(size_t)&local_258,0x109)
    ;
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x10a;
    file_08.m_begin = (iterator)&local_268;
    msg_08.m_end = pvVar9;
    msg_08.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_278,
               msg_08);
    local_b0.m_message.px = (element_type *)(upper * 0x10 + lower);
    local_b0._0_8_ = &out_exp;
    _cVar11 = 0x6f3e10;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((assertion_result *)&local_98,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)&local_b0,false);
    local_c0 = "i == upper*16 + lower";
    local_b8 = "";
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_f8 = &local_c0;
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_280 = "";
    pvVar8 = (iterator)0x2;
    pvVar9 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,&local_110,2,0xe,WARN,_cVar11,(size_t)&local_288,0x10a)
    ;
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    out_exp._M_len = out_exp._M_len + 1;
  } while (out_exp._M_len < 0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hex._M_dataplus._M_p != &hex.field_2) {
    operator_delete(hex._M_dataplus._M_p,hex.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input._M_dataplus._M_p != &input.field_2) {
    operator_delete(input._M_dataplus._M_p,input.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_HexStr)
{
    BOOST_CHECK_EQUAL(HexStr(HEX_PARSE_OUTPUT), HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.last(0)), "");
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.first(0)), "");

    {
        constexpr std::string_view out_exp{"04678afdb0"};
        constexpr std::span in_s{HEX_PARSE_OUTPUT, out_exp.size() / 2};
        const Span<const uint8_t> in_u{MakeUCharSpan(in_s)};
        const Span<const std::byte> in_b{MakeByteSpan(in_s)};

        BOOST_CHECK_EQUAL(HexStr(in_u), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_s), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_b), out_exp);
    }

    {
        auto input = std::string();
        for (size_t i=0; i<256; ++i) {
            input.push_back(static_cast<char>(i));
        }

        auto hex = HexStr(input);
        BOOST_TEST_REQUIRE(hex.size() == 512);
        static constexpr auto hexmap = std::string_view("0123456789abcdef");
        for (size_t i = 0; i < 256; ++i) {
            auto upper = hexmap.find(hex[i * 2]);
            auto lower = hexmap.find(hex[i * 2 + 1]);
            BOOST_TEST_REQUIRE(upper != std::string_view::npos);
            BOOST_TEST_REQUIRE(lower != std::string_view::npos);
            BOOST_TEST_REQUIRE(i == upper*16 + lower);
        }
    }
}